

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O0

void deqp::gls::anon_unknown_1::runTests
               (TestContext *testCtx,RenderContext *renderContext,Random *rng,deUint32 format,
               size_t bufferSize,size_t offset,size_t size,RenderBits preRender,
               ShaderProgram *preRenderProgram,ModifyBits modifyType,RenderBits postRender,
               ShaderProgram *postRenderProgram)

{
  code *pcVar1;
  undefined8 uVar2;
  int iVar3;
  deBool dVar4;
  deUint32 err;
  undefined4 extraout_var;
  long lVar6;
  TestLog *log_00;
  reference pvVar7;
  TestError *this;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  deUint8 local_26f;
  deUint8 local_26b;
  ConstPixelBufferAccess local_238;
  PixelBufferAccess local_210;
  PixelBufferAccess local_1e8;
  PixelBufferAccess local_1c0;
  undefined1 local_198 [8];
  TextureBuffer texture;
  undefined1 auStack_158 [6];
  deUint8 val;
  deUint8 i;
  undefined8 uStack_150;
  undefined1 local_148 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bufferData;
  Surface referenceTarget;
  string local_110;
  undefined1 local_f0 [8];
  ResultCollector resultCollector;
  TestLog *log;
  Vec4 clearColor;
  int height;
  int width;
  Functions *gl;
  RenderTarget renderTarget;
  size_t offset_local;
  size_t bufferSize_local;
  deUint32 format_local;
  Random *rng_local;
  RenderContext *renderContext_local;
  TestContext *testCtx_local;
  undefined4 *puVar5;
  undefined4 extraout_var_00;
  
  iVar3 = (*renderContext->_vptr_RenderContext[4])();
  puVar5 = (undefined4 *)CONCAT44(extraout_var,iVar3);
  renderTarget.m_depthBits = puVar5[8];
  gl._0_4_ = *puVar5;
  gl._4_4_ = puVar5[1];
  renderTarget.m_width = puVar5[2];
  renderTarget.m_height = puVar5[3];
  renderTarget.m_pixelFormat.redBits = puVar5[4];
  renderTarget.m_pixelFormat.greenBits = puVar5[5];
  renderTarget.m_pixelFormat.blueBits = puVar5[6];
  renderTarget.m_pixelFormat.alphaBits = puVar5[7];
  iVar3 = (*renderContext->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var_00,iVar3);
  iVar3 = tcu::RenderTarget::getWidth((RenderTarget *)&gl);
  clearColor.m_data[3] = (float)de::min<int>(iVar3,0x100);
  iVar3 = tcu::RenderTarget::getHeight((RenderTarget *)&gl);
  clearColor.m_data[2] = (float)de::min<int>(iVar3,0x100);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)&log + 4),0.25,0.5,0.75,1.0);
  log_00 = tcu::TestContext::getLog(testCtx);
  resultCollector.m_message.field_2._8_8_ = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"",(allocator<char> *)((long)&referenceTarget.m_pixels.m_cap + 7))
  ;
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_f0,log_00,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)((long)&referenceTarget.m_pixels.m_cap + 7));
  logImplementationInfo((TestLog *)resultCollector.m_message.field_2._8_8_,renderContext);
  logTextureInfo((TestLog *)resultCollector.m_message.field_2._8_8_,format,bufferSize,offset,size);
  tcu::Surface::Surface
            ((Surface *)
             &bufferData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int)clearColor.m_data[3],
             (int)clearColor.m_data[2]);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_148);
  auStack_158._0_4_ = (rng->m_rnd).x;
  unique0x10000557 = (rng->m_rnd).y;
  uStack_150._0_4_ = (rng->m_rnd).z;
  uStack_150._4_4_ = (rng->m_rnd).w;
  genRandomCoords((Random *)auStack_158,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_148,0,bufferSize);
  de::Random::~Random((Random *)auStack_158);
  for (texture.m_glBuffer._3_1_ = 0; texture.m_glBuffer._3_1_ < 4;
      texture.m_glBuffer._3_1_ = texture.m_glBuffer._3_1_ + 1) {
    texture.m_glBuffer._2_1_ = extend2BitsToByte(texture.m_glBuffer._3_1_);
    if ((offset <= texture.m_glBuffer._2_1_) && ((ulong)texture.m_glBuffer._2_1_ < offset + size)) {
      if (texture.m_glBuffer._3_1_ / 2 == 0) {
        local_26b = extend2BitsToByte('\x02');
      }
      else {
        local_26b = extend2BitsToByte('\x01');
      }
      pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_148,
                          (long)(int)((uint)texture.m_glBuffer._2_1_ << 1));
      *pvVar7 = local_26b;
      if ((uint)texture.m_glBuffer._3_1_ % 2 == 0) {
        local_26f = extend2BitsToByte('\x02');
      }
      else {
        local_26f = extend2BitsToByte('\x01');
      }
      pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_148,
                          (long)(int)((uint)texture.m_glBuffer._2_1_ * 2 + 1));
      *pvVar7 = local_26f;
    }
  }
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_148,0);
  glu::TextureBuffer::TextureBuffer
            ((TextureBuffer *)local_198,renderContext,format,bufferSize,offset,size,pvVar7);
  while( true ) {
    dVar4 = ::deGetFalse();
    if ((dVar4 != 0) || (((int)clearColor.m_data[3] < 0x40 && ((int)clearColor.m_data[2] < 0x40))))
    break;
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      (**(code **)(lVar6 + 0x1a00))(0,0,clearColor.m_data[3],clearColor.m_data[2]);
      pcVar1 = *(code **)(lVar6 + 0x1c0);
      fVar8 = tcu::Vector<float,_4>::x((Vector<float,_4> *)((long)&log + 4));
      fVar9 = tcu::Vector<float,_4>::y((Vector<float,_4> *)((long)&log + 4));
      fVar10 = tcu::Vector<float,_4>::z((Vector<float,_4> *)((long)&log + 4));
      fVar11 = tcu::Vector<float,_4>::w((Vector<float,_4> *)((long)&log + 4));
      (*pcVar1)(fVar8,fVar9,fVar10,fVar11);
      (**(code **)(lVar6 + 0x188))(0x4000);
      err = (**(code **)(lVar6 + 0x800))();
      glu::checkError(err,"Screen setup failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                      ,0x389);
      tcu::Surface::getAccess
                (&local_1c0,
                 (Surface *)
                 &bufferData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      tcu::clear(&local_1c0,(Vec4 *)((long)&log + 4));
      glu::TextureBuffer::upload((TextureBuffer *)local_198);
      uVar2 = resultCollector.m_message.field_2._8_8_;
      if (preRender != RENDERBITS_NONE) {
        tcu::Surface::getAccess
                  (&local_1e8,
                   (Surface *)
                   &bufferData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        render((TestLog *)uVar2,renderContext,preRender,rng,preRenderProgram,
               (TextureBuffer *)local_198,&local_1e8);
      }
      if (modifyType != MODIFYBITS_NONE) {
        modify((TestLog *)resultCollector.m_message.field_2._8_8_,(ResultCollector *)local_f0,
               renderContext,modifyType,rng,(TextureBuffer *)local_198);
      }
      uVar2 = resultCollector.m_message.field_2._8_8_;
      if (postRender != RENDERBITS_NONE) {
        tcu::Surface::getAccess
                  (&local_210,
                   (Surface *)
                   &bufferData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        render((TestLog *)uVar2,renderContext,postRender,rng,postRenderProgram,
               (TextureBuffer *)local_198,&local_210);
      }
      glu::TextureBuffer::~TextureBuffer((TextureBuffer *)local_198);
      uVar2 = resultCollector.m_message.field_2._8_8_;
      tcu::Surface::getAccess
                ((PixelBufferAccess *)&local_238,
                 (Surface *)
                 &bufferData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      verifyScreen((TestLog *)uVar2,(ResultCollector *)local_f0,renderContext,&local_238);
      tcu::ResultCollector::setTestContextResult((ResultCollector *)local_f0,testCtx);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_148);
      tcu::Surface::~Surface
                ((Surface *)
                 &bufferData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      tcu::ResultCollector::~ResultCollector((ResultCollector *)local_f0);
      tcu::RenderTarget::~RenderTarget((RenderTarget *)&gl);
      return;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Too small viewport",
             "width >= MIN_VIEWPORT_WIDTH || height >= MIN_VIEWPORT_HEIGHT",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
             ,0x381);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void runTests (tcu::TestContext&	testCtx,
			   glu::RenderContext&	renderContext,
			   de::Random&			rng,
			   deUint32				format,
			   size_t				bufferSize,
			   size_t				offset,
			   size_t				size,
			   RenderBits			preRender,
			   glu::ShaderProgram*	preRenderProgram,
			   ModifyBits			modifyType,
			   RenderBits			postRender,
			   glu::ShaderProgram*	postRenderProgram)
{
	const tcu::RenderTarget	renderTarget	(renderContext.getRenderTarget());
	const glw::Functions&	gl				= renderContext.getFunctions();

	const int				width			= de::min<int>(renderTarget.getWidth(), MAX_VIEWPORT_WIDTH);
	const int				height			= de::min<int>(renderTarget.getHeight(), MAX_VIEWPORT_HEIGHT);
	const tcu::Vec4			clearColor		(0.25f, 0.5f, 0.75f, 1.0f);

	TestLog&				log				= testCtx.getLog();
	tcu::ResultCollector	resultCollector	(log);

	logImplementationInfo(log, renderContext);
	logTextureInfo(log, format, bufferSize, offset, size);

	{
		tcu::Surface			referenceTarget	(width, height);
		vector<deUint8>			bufferData;

		genRandomCoords(rng, bufferData, 0, bufferSize);

		for (deUint8 i = 0; i < 4; i++)
		{
			const deUint8 val = extend2BitsToByte(i);

			if (val >= offset && val < offset + size)
			{
				bufferData[val*2 + 0] = (i / 2 == 0 ? extend2BitsToByte(0x2u) : extend2BitsToByte(0x01u));
				bufferData[val*2 + 1] = (i % 2 == 0 ? extend2BitsToByte(0x2u) : extend2BitsToByte(0x01u));
			}
		}

		{
			glu::TextureBuffer texture (renderContext, format, bufferSize, offset, size, &(bufferData[0]));

			TCU_CHECK_MSG(width >= MIN_VIEWPORT_WIDTH || height >= MIN_VIEWPORT_HEIGHT, "Too small viewport");

			DE_ASSERT(preRender == 0 || preRenderProgram);
			DE_ASSERT(postRender == 0 || postRenderProgram);

			gl.viewport(0, 0, width, height);
			gl.clearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Screen setup failed");

			tcu::clear(referenceTarget.getAccess(), clearColor);

			texture.upload();

			if (preRender != 0)
				render(log, renderContext, preRender, rng, *preRenderProgram, texture, referenceTarget.getAccess());

			if (modifyType != 0)
				modify(log, resultCollector, renderContext, modifyType, rng, texture);

			if (postRender != 0)
				render(log, renderContext, postRender, rng, *postRenderProgram, texture, referenceTarget.getAccess());
		}

		verifyScreen(log, resultCollector, renderContext, referenceTarget.getAccess());

		resultCollector.setTestContextResult(testCtx);
	}
}